

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

int secp256k1_scalar_add(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar1 = b->d[0];
  uVar2 = a->d[0];
  r->d[0] = uVar1 + a->d[0];
  uVar3 = a->d[1];
  uVar2 = (ulong)CARRY8(uVar1,uVar2);
  uVar5 = uVar3 + uVar2;
  uVar1 = b->d[1];
  r->d[1] = uVar5 + uVar1;
  uVar8 = b->d[2] + a->d[2];
  uVar9 = (ulong)CARRY8(b->d[2],a->d[2]);
  uVar6 = (ulong)CARRY8(uVar3,uVar2);
  uVar3 = (ulong)CARRY8(uVar5,uVar1);
  uVar5 = uVar6 + uVar8;
  r->d[2] = uVar5 + uVar3;
  uVar1 = b->d[3];
  uVar2 = a->d[3];
  uVar7 = uVar1 + a->d[3];
  uVar3 = (ulong)(CARRY8(uVar6,uVar8) || CARRY8(uVar5,uVar3));
  uVar5 = uVar9 + uVar7;
  r->d[3] = uVar5 + uVar3;
  iVar4 = secp256k1_scalar_check_overflow(r);
  iVar4 = secp256k1_scalar_reduce
                    (r,(uint)CARRY8(uVar1,uVar2) + iVar4 +
                       (uint)(CARRY8(uVar9,uVar7) || CARRY8(uVar5,uVar3)));
  return iVar4;
}

Assistant:

static int secp256k1_scalar_add(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    int overflow;
    uint128_t t = (uint128_t)a->d[0] + b->d[0];
    r->d[0] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)a->d[1] + b->d[1];
    r->d[1] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)a->d[2] + b->d[2];
    r->d[2] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)a->d[3] + b->d[3];
    r->d[3] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    overflow = t + secp256k1_scalar_check_overflow(r);
    VERIFY_CHECK(overflow == 0 || overflow == 1);
    secp256k1_scalar_reduce(r, overflow);
    return overflow;
}